

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_panic.c
# Opt level: O0

void writestr(int fd,char *s)

{
  size_t sVar1;
  ssize_t sVar2;
  int *piVar3;
  int local_20;
  int local_1c;
  int n;
  int len;
  char *s_local;
  int fd_local;
  
  sVar1 = strlen(s);
  local_1c = (int)sVar1;
  local_20 = 0;
  _n = s;
  while (local_1c != 0 && -1 < local_20) {
    sVar2 = write(fd,_n,(long)local_1c);
    local_20 = (int)sVar2;
    if (local_20 < 0) {
      if ((local_20 == -1) && (piVar3 = __errno_location(), *piVar3 == 4)) {
        local_20 = 0;
      }
    }
    else {
      local_1c = local_1c - local_20;
      _n = _n + local_20;
    }
  }
  return;
}

Assistant:

NSYNC_CPP_START_

/* Write the nul-terminated string s[] to file descriptor fd. */
static void writestr (int fd, const char *s) {
        int len = strlen (s);
        int n = 0;
        while (len != 0 && n >= 0) {
                n = write (fd, s, len);
                if (n >= 0) {
                        len -= n;
                        s += n;
                } else if (n == -1 && errno == EINTR) {
                        n = 0;
                }
        }
}